

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_affixes.cpp
# Opt level: O2

int8_t __thiscall
icu_63::numparse::impl::AffixMatcher::compareTo(AffixMatcher *this,AffixMatcher *rhs)

{
  int32_t iVar1;
  int32_t iVar2;
  AffixPatternMatcher **ppAVar3;
  AffixPatternMatcher **ppAVar4;
  
  iVar1 = anon_unknown.dwarf_1ebafb::length(this->fPrefix);
  iVar2 = anon_unknown.dwarf_1ebafb::length(rhs->fPrefix);
  if (iVar1 == iVar2) {
    iVar1 = anon_unknown.dwarf_1ebafb::length(this->fSuffix);
    iVar2 = anon_unknown.dwarf_1ebafb::length(rhs->fSuffix);
    if (iVar1 == iVar2) {
      return '\0';
    }
    ppAVar4 = &this->fSuffix;
    ppAVar3 = &rhs->fSuffix;
  }
  else {
    ppAVar4 = &this->fPrefix;
    ppAVar3 = &rhs->fPrefix;
  }
  iVar1 = anon_unknown.dwarf_1ebafb::length(*ppAVar4);
  iVar2 = anon_unknown.dwarf_1ebafb::length(*ppAVar3);
  return -(iVar2 < iVar1) | 1;
}

Assistant:

int8_t AffixMatcher::compareTo(const AffixMatcher& rhs) const {
    const AffixMatcher& lhs = *this;
    if (length(lhs.fPrefix) != length(rhs.fPrefix)) {
        return length(lhs.fPrefix) > length(rhs.fPrefix) ? -1 : 1;
    } else if (length(lhs.fSuffix) != length(rhs.fSuffix)) {
        return length(lhs.fSuffix) > length(rhs.fSuffix) ? -1 : 1;
    } else {
        return 0;
    }
}